

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QHeaderViewPrivate::SectionItem>::copyAppend
          (QPodArrayOps<QHeaderViewPrivate::SectionItem> *this,qsizetype n,parameter_type t)

{
  long lVar1;
  SectionItem *pSVar2;
  long lVar3;
  
  if (n != 0) {
    lVar1 = (this->super_QArrayDataPointer<QHeaderViewPrivate::SectionItem>).size;
    pSVar2 = (this->super_QArrayDataPointer<QHeaderViewPrivate::SectionItem>).ptr;
    (this->super_QArrayDataPointer<QHeaderViewPrivate::SectionItem>).size = lVar1 + n;
    for (lVar3 = 0; n != lVar3; lVar3 = lVar3 + 1) {
      pSVar2[lVar1 + lVar3] = *t;
    }
  }
  return;
}

Assistant:

void copyAppend(qsizetype n, parameter_type t) noexcept
    {
        Q_ASSERT(!this->isShared() || n == 0);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        if (!n)
            return;

        T *where = this->end();
        this->size += qsizetype(n);
        while (n--)
            *where++ = t;
    }